

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

Op adios2::query::strToQueryOp(string *opStr)

{
  int iVar1;
  Op OVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)opStr);
  OVar2 = LT;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)opStr);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)opStr);
      OVar2 = GT;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)opStr);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)opStr);
          OVar2 = GE;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)opStr);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)opStr);
              OVar2 = LE;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)opStr);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)opStr);
                  OVar2 = EQ;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)opStr);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)opStr);
                      if (iVar1 == 0) {
                        OVar2 = NE;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)opStr);
                        OVar2 = EQ - (iVar1 == 0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return OVar2;
}

Assistant:

adios2::query::Op strToQueryOp(std::string opStr) noexcept
{
    if ((opStr.compare("lt") == 0) || (opStr.compare("LT") == 0))
        return adios2::query::Op::LT;
    if ((opStr.compare("gt") == 0) || (opStr.compare("GT") == 0))
        return adios2::query::Op::GT;
    if ((opStr.compare("ge") == 0) || (opStr.compare("GE") == 0))
        return adios2::query::Op::GE;
    if ((opStr.compare("le") == 0) || (opStr.compare("LE") == 0))
        return adios2::query::Op::LE;
    if ((opStr.compare("eq") == 0) || (opStr.compare("EQ") == 0))
        return adios2::query::Op::EQ;
    if ((opStr.compare("ne") == 0) || (opStr.compare("NE") == 0))
        return adios2::query::Op::NE;

    return adios2::query::Op::EQ; // default
}